

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O3

int wabt::OptionParser::Match(char *s,string *full,bool has_argument)

{
  char *pcVar1;
  int iVar2;
  char cVar3;
  long lVar4;
  
  pcVar1 = (full->_M_dataplus)._M_p;
  cVar3 = *pcVar1;
  if (cVar3 == '\0') {
    iVar2 = 0;
    lVar4 = 0;
  }
  else {
    lVar4 = 0;
    iVar2 = 0;
    do {
      if (s[lVar4] == '\0') {
        return iVar2;
      }
      if (s[lVar4] != cVar3) {
        return -1;
      }
      iVar2 = iVar2 + 1;
      lVar4 = (long)iVar2;
      cVar3 = pcVar1[lVar4];
    } while (cVar3 != '\0');
  }
  if (s[lVar4] == '\0') {
    iVar2 = iVar2 + 1;
  }
  else {
    if (!has_argument) {
      iVar2 = -1;
    }
    if (s[lVar4] != '=') {
      iVar2 = -1;
    }
  }
  return iVar2;
}

Assistant:

int OptionParser::Match(const char* s,
                        const std::string& full,
                        bool has_argument) {
  int i;
  for (i = 0;; i++) {
    if (full[i] == '\0') {
      // Perfect match. Return +1, so it will be preferred over a longer option
      // with the same prefix.
      if (s[i] == '\0') {
        return i + 1;
      }

      // We want to fail if s is longer than full, e.g. --foobar vs. --foo.
      // However, if s ends with an '=', it's OK.
      if (!(has_argument && s[i] == '=')) {
        return -1;
      }
      break;
    }
    if (s[i] == '\0') {
      break;
    }
    if (s[i] != full[i]) {
      return -1;
    }
  }
  return i;
}